

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::writeOutfile(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  char *filename;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  Pipeline *pPVar7;
  size_type *psVar8;
  void *__buf;
  string *w_00;
  QPDFWriter w;
  allocator<char> local_a9;
  string local_a8;
  QPDFLogger local_88;
  undefined1 local_78 [32];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  _Any_data local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  code *local_28;
  
  local_78._16_8_ = (element_type *)0x0;
  local_78._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->replace_input == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_a9);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_a8.field_2._M_allocated_capacity = *psVar8;
      local_a8.field_2._8_8_ = puVar5[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar8;
      local_a8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_a8._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    QUtil::make_shared_cstr((QUtil *)(local_78 + 0x20),&local_a8);
    _Var3._M_pi = _Stack_50._M_pi;
    local_78._16_8_ = local_58;
    this_00 = local_78._24_8_;
    local_58 = (element_type *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._24_8_ = _Var3._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_78) {
      operator_delete(local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)((long)(_func_int ***)local_78._0_8_ + 1));
    }
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._16_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x18));
  }
  else {
    psVar8 = (size_type *)
             (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((char)*psVar8 == '-') && (*(char *)((long)psVar8 + 1) == '\0')) {
      p_Var2 = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_version == 0) {
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_a8,pdf);
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    filename = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (filename == (char *)0x0) {
      QPDFLogger::saveToStandardOutput
                ((peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
      QPDFLogger::getSave(&local_88,
                          SUB81((((this->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      QPDFWriter::setOutputPipeline
                ((QPDFWriter *)&local_a8,
                 (Pipeline *)
                 local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      if (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      QPDFWriter::setOutputFilename((QPDFWriter *)&local_a8,filename);
    }
    w_00 = &local_a8;
    setWriterOptions(this,(QPDFWriter *)w_00);
    QPDFWriter::write((QPDFWriter *)&local_a8,(int)w_00,__buf,(size_t)psVar8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
    }
  }
  else {
    writeJSON(this,pdf);
  }
  if ((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_40._8_8_ = (element_type *)0x0;
    local_28 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3111:21)>
               ::_M_invoke;
    local_30._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3111:21)>
         ::_M_manager;
    local_40._M_unused._M_object = this;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_40);
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_30._M_pi)(&local_40,&local_40,3);
    }
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->replace_input == true) {
    p_Var2 = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      replace_input == true) {
    QPDF::closeInputSource(pdf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (allocator<char> *)(local_78 + 0x20));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_a8.field_2._M_allocated_capacity = *psVar8;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar8;
      local_a8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_a8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_78) {
      operator_delete(local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)((long)(_func_int ***)local_78._0_8_ + 1));
    }
    bVar4 = QPDF::anyWarnings(pdf);
    if (!bVar4) {
      std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a8._M_string_length,0,'\x01');
    }
    QUtil::rename_file((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_a8._M_dataplus._M_p);
    QUtil::rename_file((char *)local_78._16_8_,
                       (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (bVar4) {
      QPDFLogger::getError
                (&local_88,
                 SUB81((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0));
      pPVar7 = Pipeline::operator<<
                         ((Pipeline *)
                          local_88.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&((this->m).
                             super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->message_prefix);
      pPVar7 = Pipeline::operator<<(pPVar7,": there are warnings; original file kept in ");
      pPVar7 = Pipeline::operator<<(pPVar7,&local_a8);
      Pipeline::operator<<(pPVar7,"\n");
      if (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      QUtil::remove_file(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
  }
  return;
}

Assistant:

void
QPDFJob::writeOutfile(QPDF& pdf)
{
    std::shared_ptr<char> temp_out;
    if (m->replace_input) {
        // Append but don't prepend to the path to generate a temporary name. This saves us from
        // having to split the path by directory and non-directory.
        temp_out = QUtil::make_shared_cstr(std::string(m->infilename.get()) + ".~qpdf-temp#");
        // m->outfilename will be restored to 0 before temp_out goes out of scope.
        m->outfilename = temp_out;
    } else if (strcmp(m->outfilename.get(), "-") == 0) {
        m->outfilename = nullptr;
    }
    if (m->json_version) {
        writeJSON(pdf);
    } else {
        // QPDFWriter must have block scope so the output file will be closed after write()
        // finishes.
        QPDFWriter w(pdf);
        if (m->outfilename) {
            w.setOutputFilename(m->outfilename.get());
        } else {
            // saveToStandardOutput has already been called, but calling it again is defensive and
            // harmless.
            m->log->saveToStandardOutput(true);
            w.setOutputPipeline(m->log->getSave().get());
        }
        setWriterOptions(w);
        w.write();
    }
    if (m->outfilename) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << m->outfilename.get() << "\n";
        });
    }
    if (m->replace_input) {
        m->outfilename = nullptr;
    }
    if (m->replace_input) {
        // We must close the input before we can rename files
        pdf.closeInputSource();
        std::string backup = std::string(m->infilename.get()) + ".~qpdf-orig";
        bool warnings = pdf.anyWarnings();
        if (!warnings) {
            backup.append(1, '#');
        }
        QUtil::rename_file(m->infilename.get(), backup.c_str());
        QUtil::rename_file(temp_out.get(), m->infilename.get());
        if (warnings) {
            *m->log->getError() << m->message_prefix
                                << ": there are warnings; original file kept in " << backup << "\n";
        } else {
            try {
                QUtil::remove_file(backup.c_str());
            } catch (QPDFSystemError& e) {
                *m->log->getError() << m->message_prefix << ": unable to delete original file ("
                                    << e.what() << ");" << " original file left in " << backup
                                    << ", but the input was successfully replaced\n";
            }
        }
    }
}